

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O1

void __thiscall
ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test *this)

{
  pointer pcVar1;
  void *pvVar2;
  bool bVar3;
  uint32_t uVar4;
  long lVar5;
  char *pcVar6;
  Amount AVar7;
  initializer_list<cfd::UtxoData> __l;
  AssertionResult gtest_ar_2;
  ElementsTransactionApi api;
  AssertionResult gtest_ar;
  uint32_t minimum_fee;
  ByteData tx;
  UtxoFilter filter;
  ConfidentialTransactionContext txc;
  ElementsAddressFactory factory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialAssetId fee_asset;
  Amount fee;
  Amount estimate_fee;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ExtPubkey key;
  ElementsConfidentialAddress reserve_ct_addr2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ConfidentialTransactionController ctx;
  ElementsConfidentialAddress reserve_ct_addr3;
  UtxoData utxo3;
  UtxoData utxo2;
  ElementsConfidentialAddress reserve_ct_addr1;
  UtxoData utxo1;
  Address address3;
  Address address2;
  Address address1;
  undefined1 local_2bf0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2be8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2be0;
  Privkey local_2bd0;
  ElementsTransactionApi local_2ba9;
  undefined1 local_2ba8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b98 [12];
  Pubkey local_2ad0;
  string local_2ab8;
  ByteData local_2a98;
  UtxoFilter local_2a7c;
  undefined1 local_2a78 [40];
  pointer local_2a50;
  pointer local_2a40;
  pointer local_2a38;
  pointer local_2a28;
  pointer local_2a18;
  _Base_ptr local_2a08;
  _Base_ptr local_2a00;
  pointer local_29f0;
  AddressFactory local_29a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2978;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_2958;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2940;
  ConfidentialAssetId local_2928;
  SigHashType local_28fc;
  SigHashType local_28f0;
  SigHashType local_28e4;
  Amount local_28d8;
  Amount local_28c8;
  CoinSelectionOption local_28b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_2850;
  ExtPubkey local_2820;
  undefined1 local_2790 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2780 [2];
  pointer local_2758;
  pointer local_2750;
  pointer local_2740;
  pointer local_2730;
  pointer local_2720;
  _func_int **local_2718;
  _func_int **local_2708;
  pointer local_2610;
  pointer local_2600;
  _Alloc_hider local_25f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_25e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_25d8;
  undefined1 local_25a8 [16];
  ConfidentialTransaction local_2598;
  undefined1 local_2558 [16];
  _Alloc_hider local_2548;
  pointer local_2540;
  undefined8 local_2530;
  pointer local_2520;
  pointer local_2518;
  pointer local_2508;
  pointer local_24f8;
  pointer local_24e8;
  _func_int **local_24e0;
  _func_int **local_24d0;
  pointer local_23d8;
  pointer local_23c8;
  _Alloc_hider local_23c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_23b0;
  undefined1 local_23a0 [40];
  Txid local_2378;
  uint32_t local_2358;
  Script local_2350 [2];
  Address local_22e0;
  undefined1 local_2160 [8];
  char *local_2158;
  Amount local_2140;
  AddressType local_2130;
  void *local_2128;
  ConfidentialAssetId local_2120 [17];
  undefined1 local_1e78 [40];
  Txid local_1e50;
  uint32_t local_1e30;
  Script local_1e28 [2];
  Address local_1db8;
  undefined1 local_1c38 [8];
  char *local_1c30;
  Amount local_1c18;
  AddressType local_1c08;
  void *local_1c00;
  ConfidentialAssetId local_1bf8 [17];
  undefined1 local_1950 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1940 [23];
  pointer local_17d0;
  pointer local_17c0;
  _Alloc_hider local_17b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_17a8 [56];
  UtxoData local_1428;
  UtxoData local_f00;
  UtxoData local_9d8;
  Address local_4b0;
  Address local_330;
  Address local_1b0;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_29a0,kElementsRegtest);
  cfd::UtxoData::UtxoData(&local_9d8);
  local_9d8.block_height = 0;
  local_9d8.binary_data = (void *)0x0;
  pcVar1 = local_1e78 + 0x10;
  local_1e78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e78,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1950,(string *)local_1e78);
  cfd::core::Txid::operator=(&local_9d8.txid,(Txid *)local_1950);
  local_1950._0_8_ = &PTR__Txid_0087c9b8;
  pvVar2 = (void *)CONCAT71(local_1950._9_7_,local_1950[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1940[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_1e78._0_8_ != pcVar1) {
    operator_delete((void *)local_1e78._0_8_,local_1e78._16_8_ + 1);
  }
  local_9d8.vout = 0;
  local_1e78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e78,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac","");
  cfd::core::Script::Script((Script *)local_1950,(string *)local_1e78);
  cfd::core::Script::operator=(&local_9d8.locking_script,(Script *)local_1950);
  cfd::core::Script::~Script((Script *)local_1950);
  if ((pointer)local_1e78._0_8_ != pcVar1) {
    operator_delete((void *)local_1e78._0_8_,local_1e78._16_8_ + 1);
  }
  local_1e78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e78,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress((Address *)local_1950,&local_29a0,(string *)local_1e78);
  cfd::core::Address::operator=(&local_9d8.address,(Address *)local_1950);
  cfd::core::Address::~Address((Address *)local_1950);
  if ((pointer)local_1e78._0_8_ != pcVar1) {
    operator_delete((void *)local_1e78._0_8_,local_1e78._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&local_9d8.descriptor,0,(char *)local_9d8.descriptor._M_string_length,0x5c567b);
  cfd::core::Amount::Amount((Amount *)local_1950,300000000000000);
  local_9d8.amount.ignore_check_ = local_1950[8];
  local_9d8.amount.amount_ = local_1950._0_8_;
  local_9d8.address_type = kP2pkhAddress;
  cfd::core::ConfidentialAssetId::operator=(&local_9d8.asset,&exp_dummy_asset_a);
  cfd::UtxoData::UtxoData((UtxoData *)local_1e78);
  local_1e78._0_8_ = (pointer)0x0;
  local_1c00 = (void *)0x0;
  pcVar1 = local_23a0 + 0x10;
  local_23a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23a0,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1950,(string *)local_23a0);
  cfd::core::Txid::operator=(&local_1e50,(Txid *)local_1950);
  local_1950._0_8_ = &PTR__Txid_0087c9b8;
  pvVar2 = (void *)CONCAT71(local_1950._9_7_,local_1950[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1940[0]._8_8_ - (long)pvVar2);
  }
  if ((pointer)local_23a0._0_8_ != pcVar1) {
    operator_delete((void *)local_23a0._0_8_,local_23a0._16_8_ + 1);
  }
  local_1e30 = 0;
  local_23a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23a0,"a9145d54db96a28f844a744e393fcd699d6f825b284187","");
  cfd::core::Script::Script((Script *)local_1950,(string *)local_23a0);
  cfd::core::Script::operator=(local_1e28,(Script *)local_1950);
  cfd::core::Script::~Script((Script *)local_1950);
  if ((pointer)local_23a0._0_8_ != pcVar1) {
    operator_delete((void *)local_23a0._0_8_,local_23a0._16_8_ + 1);
  }
  local_23a0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_23a0,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE","");
  cfd::AddressFactory::GetAddress((Address *)local_1950,&local_29a0,(string *)local_23a0);
  cfd::core::Address::operator=(&local_1db8,(Address *)local_1950);
  cfd::core::Address::~Address((Address *)local_1950);
  if ((pointer)local_23a0._0_8_ != pcVar1) {
    operator_delete((void *)local_23a0._0_8_,local_23a0._16_8_ + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_1c38,0,local_1c30,0x58a2c5);
  cfd::core::Amount::Amount((Amount *)local_1950,400000000000000);
  local_1c18.ignore_check_ = local_1950[8];
  local_1c18.amount_ = local_1950._0_8_;
  local_1c08 = kP2shP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(local_1bf8,&exp_dummy_asset_a);
  cfd::UtxoData::UtxoData((UtxoData *)local_23a0);
  local_23a0._0_8_ = (pointer)0x0;
  local_2128 = (void *)0x0;
  local_2790._0_8_ = local_2780;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2790,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1950,(string *)local_2790);
  cfd::core::Txid::operator=(&local_2378,(Txid *)local_1950);
  local_1950._0_8_ = &PTR__Txid_0087c9b8;
  pvVar2 = (void *)CONCAT71(local_1950._9_7_,local_1950[8]);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_1940[0]._8_8_ - (long)pvVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2790._0_8_ != local_2780) {
    operator_delete((void *)local_2790._0_8_,local_2780[0]._M_allocated_capacity + 1);
  }
  local_2358 = 1;
  local_2790._0_8_ = local_2780;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2790,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4","");
  cfd::core::Script::Script((Script *)local_1950,(string *)local_2790);
  cfd::core::Script::operator=(local_2350,(Script *)local_1950);
  cfd::core::Script::~Script((Script *)local_1950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2790._0_8_ != local_2780) {
    operator_delete((void *)local_2790._0_8_,local_2780[0]._M_allocated_capacity + 1);
  }
  local_2790._0_8_ = local_2780;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2790,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress((Address *)local_1950,&local_29a0,(string *)local_2790);
  cfd::core::Address::operator=(&local_22e0,(Address *)local_1950);
  cfd::core::Address::~Address((Address *)local_1950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2790._0_8_ != local_2780) {
    operator_delete((void *)local_2790._0_8_,local_2780[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)local_2160,0,local_2158,0x5c567a);
  cfd::core::Amount::Amount((Amount *)local_1950,300000000000000);
  local_2140.ignore_check_ = local_1950[8];
  local_2140.amount_ = local_1950._0_8_;
  local_2130 = kP2wpkhAddress;
  cfd::core::ConfidentialAssetId::operator=(local_2120,&exp_dummy_asset_a);
  local_1950._0_8_ = local_1940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1950,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph","");
  cfd::AddressFactory::GetAddress(&local_1b0,&local_29a0,(string *)local_1950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1950._0_8_ != local_1940) {
    operator_delete((void *)local_1950._0_8_,(ulong)(local_1940[0]._M_allocated_capacity + 1));
  }
  local_1950._0_8_ = local_1940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1950,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu","");
  cfd::AddressFactory::GetAddress(&local_330,&local_29a0,(string *)local_1950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1950._0_8_ != local_1940) {
    operator_delete((void *)local_1950._0_8_,(ulong)(local_1940[0]._M_allocated_capacity + 1));
  }
  local_1950._0_8_ = local_1940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1950,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w","");
  cfd::AddressFactory::GetAddress(&local_4b0,&local_29a0,(string *)local_1950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1950._0_8_ != local_1940) {
    operator_delete((void *)local_1950._0_8_,(ulong)(local_1940[0]._M_allocated_capacity + 1));
  }
  local_1950._0_8_ = local_1940;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1950,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_2820,(string *)local_1950);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1950._0_8_ != local_1940) {
    operator_delete((void *)local_1950._0_8_,(ulong)(local_1940[0]._M_allocated_capacity + 1));
  }
  cfd::UtxoData::UtxoData((UtxoData *)local_1950,&local_9d8);
  cfd::UtxoData::UtxoData(&local_1428,(UtxoData *)local_1e78);
  cfd::UtxoData::UtxoData(&local_f00,(UtxoData *)local_23a0);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1950;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2940,__l,(allocator_type *)local_2790);
  lVar5 = 0xa50;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1950 + lVar5));
    lVar5 = lVar5 + -0x528;
  } while (lVar5 != -0x528);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2790,&local_2820,0x5b);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_2558,(Extkey *)local_2790);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_1950,&local_1b0,(ConfidentialKey *)local_2558);
  if ((pointer)local_2558._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2558._0_8_,(long)local_2548._M_p - local_2558._0_8_);
  }
  if (local_2718 != (_func_int **)0x0) {
    operator_delete(local_2718,(long)local_2708 - (long)local_2718);
  }
  if (local_2730 != (pointer)0x0) {
    operator_delete(local_2730,(long)local_2720 - (long)local_2730);
  }
  if (local_2750 != (pointer)0x0) {
    operator_delete(local_2750,(long)local_2740 - (long)local_2750);
  }
  if ((pointer)local_2780[1]._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2780[1]._8_8_,(long)local_2758 - local_2780[1]._8_8_);
  }
  if ((pointer)local_2790._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2790._8_8_,local_2780[0]._8_8_ - local_2790._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2558,&local_2820,0x5c);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_2a78,(Extkey *)local_2558);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_2790,&local_330,(ConfidentialKey *)local_2a78);
  if ((pointer)local_2a78._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a78._0_8_,local_2a78._16_8_ - local_2a78._0_8_);
  }
  if (local_24e0 != (_func_int **)0x0) {
    operator_delete(local_24e0,(long)local_24d0 - (long)local_24e0);
  }
  if (local_24f8 != (pointer)0x0) {
    operator_delete(local_24f8,(long)local_24e8 - (long)local_24f8);
  }
  if (local_2518 != (pointer)0x0) {
    operator_delete(local_2518,(long)local_2508 - (long)local_2518);
  }
  if ((pointer)local_2530 != (pointer)0x0) {
    operator_delete((void *)local_2530,(long)local_2520 - local_2530);
  }
  if ((pointer)local_2558._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2558._8_8_,(long)local_2540 - local_2558._8_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_2a78,&local_2820,0x5d);
  cfd::core::Extkey::GetPubkey((Pubkey *)local_2ba8,(Extkey *)local_2a78);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_2558,&local_4b0,(ConfidentialKey *)local_2ba8);
  if (local_2ba8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2ba8,local_2b98[0]._M_allocated_capacity - (long)local_2ba8);
  }
  if (local_2a00 != (_Base_ptr)0x0) {
    operator_delete(local_2a00,(long)local_29f0 - (long)local_2a00);
  }
  if (local_2a18 != (pointer)0x0) {
    operator_delete(local_2a18,(long)local_2a08 - (long)local_2a18);
  }
  if (local_2a38 != (pointer)0x0) {
    operator_delete(local_2a38,(long)local_2a28 - (long)local_2a38);
  }
  if (local_2a50 != (pointer)0x0) {
    operator_delete(local_2a50,(long)local_2a40 - (long)local_2a50);
  }
  if ((pointer)local_2a78._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a78._8_8_,local_2a78._24_8_ - local_2a78._8_8_);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_2928,&exp_dummy_asset_a);
  local_2850._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2850._M_impl.super__Rb_tree_header._M_header;
  local_2850._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2850._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2850._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2850._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2850._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2a78,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)local_2ba8,0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_2850,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a78,
             (Amount *)local_2ba8);
  if ((undefined1 *)local_2a78._0_8_ != local_2a78 + 0x10) {
    operator_delete((void *)local_2a78._0_8_,(ulong)(local_2a78._16_8_ + 1));
  }
  local_25d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_25d8._M_impl.super__Rb_tree_header._M_header;
  local_25d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_25d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_25d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_25d8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_25d8._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2a78,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
            ((string *)local_2ba8,(ElementsConfidentialAddress *)local_2558);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_25d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2ba8);
  if (local_2ba8 != (undefined1  [8])local_2b98) {
    operator_delete((void *)local_2ba8,(ulong)(local_2b98[0]._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_2a78._0_8_ != local_2a78 + 0x10) {
    operator_delete((void *)local_2a78._0_8_,(ulong)(local_2a78._16_8_ + 1));
  }
  local_2958.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2958.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2958.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&local_28c8);
  local_2978.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2978.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2978.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_28b8);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_28b8);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_28b8,0.11);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_28b8,0.11);
  cfd::CoinSelectionOption::SetFeeAsset(&local_28b8,&local_2928);
  cfd::CoinSelectionOption::SetBlindInfo(&local_28b8,0,0x34);
  cfd::core::Amount::Amount(&local_28d8,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2a78,2,0);
  AVar7 = cfd::core::operator+(&local_9d8.amount,&local_2140);
  local_25a8._0_8_ = AVar7.amount_;
  local_25a8[8] = AVar7.ignore_check_;
  AVar7 = cfd::core::operator-((Amount *)local_25a8,&local_28d8);
  local_2ba8 = (undefined1  [8])AVar7.amount_;
  local_2ba0.ptr_._0_1_ = AVar7.ignore_check_;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)local_2a78,(ElementsConfidentialAddress *)local_1950,
             (Amount *)local_2ba8,&exp_dummy_asset_a,false);
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ConfidentialTransactionContext *)local_2a78,(ElementsConfidentialAddress *)local_2790,
             &local_1c18,&exp_dummy_asset_a,false);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_2ba8,(AbstractTransaction *)local_2a78);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            ((ConfidentialTransactionController *)local_25a8,&local_2ba9,(string *)local_2ba8,
             &local_2940,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_2850,&local_2958,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_25d8,&local_2928,true,0.11,&local_28c8,&local_2a7c,&local_28b8,&local_2978,
             kCfdInvalidSettingError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_2ba8 != (undefined1  [8])local_2b98) {
    operator_delete((void *)local_2ba8,(ulong)(local_2b98[0]._M_allocated_capacity + 1));
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_2bf0,(AbstractTransactionController *)local_25a8);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2ba8,(string *)local_2bf0);
  cfd::ConfidentialTransactionContext::operator=
            ((ConfidentialTransactionContext *)local_2a78,
             (ConfidentialTransactionContext *)local_2ba8);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2ba8);
  if (local_2bf0 != (undefined1  [8])&local_2be0) {
    operator_delete((void *)local_2bf0,local_2be0._M_allocated_capacity + 1);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                ((ConfidentialTransactionContext *)local_2a78,&local_2940);
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3a6,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  cfd::core::ByteData::ByteData(&local_2a98);
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2ba8,&local_9d8.txid,local_9d8.vout);
      local_2bf0 = (undefined1  [8])&local_2be0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2bf0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2ad0,(string *)local_2bf0);
      local_2ab8._M_dataplus._M_p = (pointer)&local_2ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2ab8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_2bd0,&local_2ab8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_28e4);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2a78,(OutPoint *)local_2ba8,&local_2ad0,
                 &local_2bd0,&local_28e4,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2bd0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2bd0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2bd0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2ab8._M_dataplus._M_p != &local_2ab8.field_2) {
        operator_delete(local_2ab8._M_dataplus._M_p,local_2ab8.field_2._M_allocated_capacity + 1);
      }
      if (local_2ad0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2ad0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2ad0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2ad0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2bf0 != (undefined1  [8])&local_2be0) {
        operator_delete((void *)local_2bf0,local_2be0._M_allocated_capacity + 1);
      }
      local_2ba8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_2b98[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3ad,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2ba8,&local_9d8.txid,local_9d8.vout);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2a78,(OutPoint *)local_2ba8);
      local_2ba8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_2b98[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3ae,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::ConfidentialTransactionContext::Finalize
              ((ByteData *)local_2ba8,(ConfidentialTransactionContext *)local_2a78);
    cfd::core::ByteData::operator=(&local_2a98,(ByteData *)local_2ba8);
    if (local_2ba8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2ba8,local_2b98[0]._M_allocated_capacity - (long)local_2ba8);
    }
  }
  testing::Message::Message((Message *)local_2ba8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2bf0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x3af,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
  if (local_2ba8 != (undefined1  [8])0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2ba8 + 8))();
    }
    local_2ba8 = (undefined1  [8])0x0;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2ba8,&local_1e50,local_1e30);
      local_2bf0 = (undefined1  [8])&local_2be0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2bf0,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
      cfd::core::Pubkey::Pubkey(&local_2ad0,(string *)local_2bf0);
      local_2ab8._M_dataplus._M_p = (pointer)&local_2ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2ab8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
      cfd::core::Privkey::FromWif(&local_2bd0,&local_2ab8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_28f0);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2a78,(OutPoint *)local_2ba8,&local_2ad0,
                 &local_2bd0,&local_28f0,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2bd0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2bd0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2bd0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2ab8._M_dataplus._M_p != &local_2ab8.field_2) {
        operator_delete(local_2ab8._M_dataplus._M_p,local_2ab8.field_2._M_allocated_capacity + 1);
      }
      if (local_2ad0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2ad0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2ad0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2ad0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2bf0 != (undefined1  [8])&local_2be0) {
        operator_delete((void *)local_2bf0,local_2be0._M_allocated_capacity + 1);
      }
      local_2ba8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_2b98[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3b4,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2ba8,&local_1e50,local_1e30);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2a78,(OutPoint *)local_2ba8);
      local_2ba8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_2b98[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3b5,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    cfd::ConfidentialTransactionContext::Finalize
              ((ByteData *)local_2ba8,(ConfidentialTransactionContext *)local_2a78);
    cfd::core::ByteData::operator=(&local_2a98,(ByteData *)local_2ba8);
    if (local_2ba8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2ba8,local_2b98[0]._M_allocated_capacity - (long)local_2ba8);
    }
  }
  testing::Message::Message((Message *)local_2ba8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_2bf0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x3b6,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
  if (local_2ba8 != (undefined1  [8])0x0) {
    bVar3 = testing::internal::IsTrue(true);
    if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_2ba8 + 8))();
    }
    local_2ba8 = (undefined1  [8])0x0;
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2ba8,&local_2378,local_2358);
      local_2bf0 = (undefined1  [8])&local_2be0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2bf0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_2ad0,(string *)local_2bf0);
      local_2ab8._M_dataplus._M_p = (pointer)&local_2ab8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2ab8,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_2bd0,&local_2ab8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_28fc);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_2a78,(OutPoint *)local_2ba8,&local_2ad0,
                 &local_2bd0,&local_28fc,true,(ByteData256 *)0x0,(ByteData *)0x0);
      if (local_2bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2bd0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2bd0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2bd0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2ab8._M_dataplus._M_p != &local_2ab8.field_2) {
        operator_delete(local_2ab8._M_dataplus._M_p,local_2ab8.field_2._M_allocated_capacity + 1);
      }
      if (local_2ad0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2ad0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2ad0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2ad0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_2bf0 != (undefined1  [8])&local_2be0) {
        operator_delete((void *)local_2bf0,local_2be0._M_allocated_capacity + 1);
      }
      local_2ba8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_2b98[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3bb,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_2ba8,&local_2378,local_2358);
      cfd::ConfidentialTransactionContext::Verify
                ((ConfidentialTransactionContext *)local_2a78,(OutPoint *)local_2ba8);
      local_2ba8 = (undefined1  [8])&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,local_2b98[0]._8_8_ - (long)pvVar2);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3bc,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ByteData *)local_2ba8,(ConfidentialTransactionContext *)local_2a78);
      cfd::core::ByteData::operator=(&local_2a98,(ByteData *)local_2ba8);
      if (local_2ba8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_2ba8,local_2b98[0]._M_allocated_capacity - (long)local_2ba8);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_2ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2bf0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3be,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2bf0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2bf0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  AVar7 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    ((ConfidentialTransactionContext *)local_2a78,(ConfidentialAssetId *)0x0);
  local_2bf0 = (undefined1  [8])AVar7.amount_;
  local_2be8.ptr_._0_1_ = AVar7.ignore_check_;
  local_2bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2bf0);
  local_2ab8._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue(&local_28c8);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_2ba8,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_2bd0,(long *)&local_2ab8);
  if (local_2ba8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2bf0);
    if ((undefined8 *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3bf,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2bd0,(Message *)local_2bf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2bd0);
    if (local_2bf0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2bf0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2bf0 + 8))();
      }
      local_2bf0 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2ba0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2ba8,&local_2a98);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2bf0,"tx.GetHex().c_str()",
             "\"020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000\""
             ,(char *)local_2ba8,
             "020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000"
            );
  if (local_2ba8 != (undefined1  [8])local_2b98) {
    operator_delete((void *)local_2ba8,(ulong)(local_2b98[0]._M_allocated_capacity + 1));
  }
  if (local_2bf0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_2ba8);
    if ((undefined8 *)CONCAT71(local_2be8.ptr_._1_7_,local_2be8.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_2be8.ptr_._1_7_,local_2be8.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3c0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2bd0,(Message *)local_2ba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2bd0);
    if (local_2ba8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2ba8 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_2ba8 + 8))();
      }
      local_2ba8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2be8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_2a78);
  local_2bf0._0_4_ = uVar4;
  local_2bd0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2bd0.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x296);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2ba8,"txc.GetVsize()","662",(uint *)local_2bf0,(int *)&local_2bd0);
  if (local_2ba8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2bf0);
    if ((undefined8 *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3c1,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2bd0,(Message *)local_2bf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2bd0);
    if (local_2bf0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2bf0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2bf0 + 8))();
      }
      local_2bf0 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2ba0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_2a78);
  local_2ab8._M_dataplus._M_p._0_4_ = (uVar4 * 0xb) / 100;
  local_2bf0._0_4_ = 0x48;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_2ba8,"minimum_fee","72",(uint *)&local_2ab8,(int *)local_2bf0);
  if (local_2ba8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2bf0);
    if ((undefined8 *)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_2ba0.ptr_._1_7_,local_2ba0.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3c4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2bd0,(Message *)local_2bf0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2bd0);
    if (local_2bf0 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2bf0 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2bf0 + 8))();
      }
      local_2bf0 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2ba0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_2a98.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a98.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a98.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a98.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_25a8._0_8_ = &PTR__ConfidentialTransactionController_0087c940;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_2598);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_2a78);
  local_28b8.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8
  ;
  if (local_28b8.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28b8.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28b8.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28b8.fee_asset_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2978);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_2958);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_25d8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_2850);
  local_2928._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
  if (local_2928.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2928.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2928.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2928.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_23c0._M_p != &local_23b0) {
    operator_delete(local_23c0._M_p,local_23b0._M_allocated_capacity + 1);
  }
  if (local_23d8 != (pointer)0x0) {
    operator_delete(local_23d8,(long)local_23c8 - (long)local_23d8);
  }
  cfd::core::Address::~Address((Address *)local_2558);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25f8._M_p != &local_25e8) {
    operator_delete(local_25f8._M_p,local_25e8._M_allocated_capacity + 1);
  }
  if (local_2610 != (pointer)0x0) {
    operator_delete(local_2610,(long)local_2600 - (long)local_2610);
  }
  cfd::core::Address::~Address((Address *)local_2790);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_17b8._M_p != local_17a8) {
    operator_delete(local_17b8._M_p,(ulong)(local_17a8[0]._M_allocated_capacity + 1));
  }
  if (local_17d0 != (pointer)0x0) {
    operator_delete(local_17d0,(long)local_17c0 - (long)local_17d0);
  }
  cfd::core::Address::~Address((Address *)local_1950);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2940);
  if (local_2820.super_Extkey.tweak_sum_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.super_Extkey.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.super_Extkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2820.super_Extkey.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.super_Extkey.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.super_Extkey.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2820.super_Extkey.privkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.super_Extkey.privkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.super_Extkey.privkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2820.super_Extkey.chaincode_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.super_Extkey.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.super_Extkey.chaincode_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2820.super_Extkey.fingerprint_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2820.super_Extkey.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2820.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2820.super_Extkey.fingerprint_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cfd::core::Address::~Address(&local_4b0);
  cfd::core::Address::~Address(&local_330);
  cfd::core::Address::~Address(&local_1b0);
  cfd::UtxoData::~UtxoData((UtxoData *)local_23a0);
  cfd::UtxoData::~UtxoData((UtxoData *)local_1e78);
  cfd::UtxoData::~UtxoData(&local_9d8);
  local_29a0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_0087aa98;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_29a0.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MillionAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{300000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_a;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{400000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_a;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{300000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo1.amount + utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, utxo2.amount, exp_dummy_asset_a);

  ElementsTransactionApi api;
  ConfidentialTransactionController ctx = api.FundRawTransaction(
      txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
      reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
      &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

  txc = ConfidentialTransactionContext(ctx.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 662);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 72);
}